

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O2

Expression * __thiscall rsg::SwizzleOp::createNextChild(SwizzleOp *this,GeneratorState *state)

{
  pointer *ppiVar1;
  byte bVar2;
  uint uVar3;
  pointer pSVar4;
  pointer pSVar5;
  ValueRangeAccess valueRange;
  ValueRangeAccess dst;
  ConstValueRangeAccess valueRange_00;
  pointer pSVar6;
  Scalar *pSVar7;
  VariableType *pVVar8;
  Expression *pEVar9;
  pointer pSVar10;
  deUint8 *pdVar11;
  Scalar *pSVar12;
  pointer pSVar13;
  pointer pSVar14;
  long lVar15;
  pointer pSVar16;
  pointer pSVar17;
  ConstValueRangeAccess local_130;
  ConstValueRangeAccess local_118;
  ValueRange inValueRange;
  VariableType inVarType;
  
  if (this->m_child == (Expression *)0x0) {
    inVarType.m_baseType = (this->m_outValueRange).m_type.m_baseType;
    inVarType.m_numElements = this->m_numInputElements;
    inVarType.m_typeName._M_dataplus._M_p = (pointer)&inVarType.m_typeName.field_2;
    inVarType.m_precision = PRECISION_NONE;
    inVarType.m_typeName._M_string_length = 0;
    inVarType.m_typeName.field_2._M_local_buf[0] = '\0';
    inVarType.m_elementType = (VariableType *)0x0;
    inVarType.m_members.
    super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    inVarType.m_members.
    super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    inVarType.m_members.
    super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ValueRange::ValueRange(&inValueRange,&inVarType);
    pSVar12 = (Scalar *)0x0;
    pSVar16 = inValueRange.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (inValueRange.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_start ==
        inValueRange.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pSVar16 = pSVar12;
    }
    pSVar10 = inValueRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (inValueRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_start ==
        inValueRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pSVar10 = pSVar12;
    }
    valueRange.super_ConstValueRangeAccess.m_min = pSVar16;
    valueRange.super_ConstValueRangeAccess.m_type = &inValueRange.m_type;
    valueRange.super_ConstValueRangeAccess.m_max = pSVar10;
    anon_unknown_0::setInfiniteRange(valueRange);
    uVar3 = (this->m_outValueRange).m_type.m_numElements;
    pdVar11 = this->m_swizzle;
    pSVar7 = (Scalar *)(ulong)uVar3;
    if ((int)uVar3 < 1) {
      pSVar7 = pSVar12;
    }
    for (lVar15 = 0;
        pSVar4 = inValueRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                 _M_impl.super__Vector_impl_data._M_finish,
        pSVar13 = inValueRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                  _M_impl.super__Vector_impl_data._M_start,
        pSVar10 = inValueRange.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                  _M_impl.super__Vector_impl_data._M_finish,
        pSVar16 = inValueRange.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                  _M_impl.super__Vector_impl_data._M_start, (long)pSVar7 << 2 != lVar15;
        lVar15 = lVar15 + 4) {
      bVar2 = *pdVar11;
      pVVar8 = VariableType::getElementType(&inValueRange.m_type);
      pSVar6 = inValueRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      pSVar17 = inValueRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pSVar5 = inValueRange.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      pSVar14 = inValueRange.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (pSVar13 == pSVar4) {
        pSVar13 = (pointer)0x0;
      }
      if (pSVar16 == pSVar10) {
        pSVar16 = (pointer)0x0;
      }
      local_118.m_type = VariableType::getElementType(&inValueRange.m_type);
      if (pSVar17 == pSVar6) {
        pSVar17 = (pointer)0x0;
      }
      if (pSVar14 == pSVar5) {
        pSVar14 = (pointer)0x0;
      }
      local_118.m_min = pSVar14 + bVar2;
      local_118.m_max = pSVar17 + bVar2;
      pSVar10 = (this->m_outValueRange).m_min.
                super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                super__Vector_impl_data._M_start;
      pSVar4 = (this->m_outValueRange).m_min.
               super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pSVar14 = (this->m_outValueRange).m_max.
                super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                super__Vector_impl_data._M_start;
      pSVar5 = (this->m_outValueRange).m_max.
               super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
               super__Vector_impl_data._M_finish;
      local_130.m_type = VariableType::getElementType(&(this->m_outValueRange).m_type);
      if (pSVar14 == pSVar5) {
        pSVar14 = (pointer)0x0;
      }
      if (pSVar10 == pSVar4) {
        pSVar10 = (pointer)0x0;
      }
      local_130.m_min = (Scalar *)((long)pSVar10 + lVar15);
      local_130.m_max = (Scalar *)((long)pSVar14 + lVar15);
      dst.super_ConstValueRangeAccess.m_min = (Scalar *)((long)pSVar16 + (ulong)((uint)bVar2 * 4));
      dst.super_ConstValueRangeAccess.m_type = pVVar8;
      dst.super_ConstValueRangeAccess.m_max = (Scalar *)((long)pSVar13 + (ulong)((uint)bVar2 * 4));
      ValueRange::computeIntersection(dst,&local_118,&local_130);
      pdVar11 = pdVar11 + 1;
    }
    GeneratorState::pushPrecedence(state,2);
    if (inValueRange.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_start ==
        inValueRange.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      inValueRange.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
      super__Vector_impl_data._M_start = (Scalar *)0x0;
    }
    if (inValueRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_start ==
        inValueRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      inValueRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
      super__Vector_impl_data._M_start = (Scalar *)0x0;
    }
    valueRange_00.m_min =
         inValueRange.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
         super__Vector_impl_data._M_start;
    valueRange_00.m_type = &inValueRange.m_type;
    valueRange_00.m_max =
         inValueRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
         super__Vector_impl_data._M_start;
    pEVar9 = Expression::createRandom(state,valueRange_00);
    this->m_child = pEVar9;
    ppiVar1 = &(state->m_precedenceStack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppiVar1 = *ppiVar1 + -1;
    ValueRange::~ValueRange(&inValueRange);
    VariableType::~VariableType(&inVarType);
  }
  else {
    pEVar9 = (Expression *)0x0;
  }
  return pEVar9;
}

Assistant:

Expression* SwizzleOp::createNextChild (GeneratorState& state)
{
	if (m_child)
		return DE_NULL;

	// Compute input value range.
	VariableType	inVarType		= VariableType(m_outValueRange.getType().getBaseType(), m_numInputElements);
	ValueRange		inValueRange	= ValueRange(inVarType);

	// Initialize all inputs to -inf..inf
	setInfiniteRange(inValueRange);

	// Compute intersections.
	int numOutputElements = m_outValueRange.getType().getNumElements();
	for (int outElemNdx = 0; outElemNdx < numOutputElements; outElemNdx++)
	{
		int inElemNdx = m_swizzle[outElemNdx];
		ValueRange::computeIntersection(inValueRange.asAccess().component(inElemNdx), inValueRange.asAccess().component(inElemNdx), m_outValueRange.asAccess().component(outElemNdx));
	}

	// Create child.
	state.pushPrecedence(swizzlePrecedence);
	m_child = Expression::createRandom(state, inValueRange.asAccess());
	state.popPrecedence();

	return m_child;
}